

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::ShaderCompile::exec(ShaderCompile *this,Thread *t)

{
  code *pcVar1;
  deUint32 err;
  deBool dVar2;
  MessageBuilder *pMVar3;
  Shader *pSVar4;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  ShaderCompile *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [26])"Begin -- glCompileShader(");
  pSVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&pSVar4->shader);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x5b492c);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
  do {
    pcVar1 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x248);
    pSVar4 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
    (*pcVar1)(pSVar4->shader);
    err = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"compileShader(m_shader->shader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x5aa);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
  pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_350,(char (*) [25])"End -- glCompileShader()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
  return;
}

Assistant:

void ShaderCompile::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glCompileShader(" << m_shader->shader << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, compileShader(m_shader->shader));
	thread.newMessage() << "End -- glCompileShader()" << tcu::ThreadUtil::Message::End;
}